

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIntegerStateQueryTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramPipelineBindingCase::iterate
          (ProgramPipelineBindingCase *this)

{
  int iVar1;
  deUint32 dVar2;
  deBool dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  Enum<int,_2UL> EVar6;
  GetNameFunc local_358;
  int local_350;
  string local_348;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  GLenum local_29c;
  GLuint local_298;
  deUint32 err_1;
  GLuint pipeline_1;
  allocator<char> local_269;
  string local_268;
  ScopedLogSection local_248;
  ScopedLogSection section_2;
  TestLog *local_230;
  int local_228;
  string local_220;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  GLenum local_174;
  undefined1 local_170 [4];
  deUint32 err;
  ProgramPipeline pipeline;
  string local_158;
  allocator<char> local_131;
  string local_130;
  ScopedLogSection local_110;
  ScopedLogSection section_1;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  ScopedLogSection local_b8;
  ScopedLogSection section;
  allocator<char> local_99;
  string local_98;
  undefined1 local_78 [8];
  ResultCollector result;
  CallLogWrapper gl;
  ProgramPipelineBindingCase *this_local;
  
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98," // ERROR: ",&local_99);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_78,pTVar5,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Initial",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"Initial value",(allocator<char> *)((long)&section_1.m_log + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_b8,pTVar5,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x825a,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&local_b8);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"AfterBinding",&local_131)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"After binding",(allocator<char> *)&pipeline.field_0xf);
  tcu::ScopedLogSection::ScopedLogSection(&local_110,pTVar5,&local_130,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&pipeline.field_0xf);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator(&local_131);
  pRVar4 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramPipeline::ProgramPipeline((ProgramPipeline *)local_170,pRVar4);
  dVar2 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)local_170);
  glu::CallLogWrapper::glBindProgramPipeline
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),dVar2);
  do {
    local_174 = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_174 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"Got Error ",&local_1f9);
      EVar6 = glu::getErrorStr(local_174);
      section_2.m_log = (TestLog *)EVar6.m_getName;
      local_228 = EVar6.m_value;
      local_230 = section_2.m_log;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_220,&local_230);
      std::operator+(&local_1d8,&local_1f8,&local_220);
      std::operator+(&local_1b8,&local_1d8,": ");
      std::operator+(&local_198,&local_1b8,"setup");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar2 = glu::ProgramPipeline::getPipeline((ProgramPipeline *)local_170);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x825a,dVar2,this->m_verifierType);
  glu::ProgramPipeline::~ProgramPipeline((ProgramPipeline *)local_170);
  tcu::ScopedLogSection::~ScopedLogSection(&local_110);
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"AfterDelete",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pipeline_1,"After deleting",(allocator<char> *)((long)&err_1 + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_248,pTVar5,&local_268,(string *)&pipeline_1);
  std::__cxx11::string::~string((string *)&pipeline_1);
  std::allocator<char>::~allocator((allocator<char> *)((long)&err_1 + 3));
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  local_298 = 0;
  glu::CallLogWrapper::glGenProgramPipelines
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_298);
  glu::CallLogWrapper::glBindProgramPipeline
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),local_298);
  glu::CallLogWrapper::glDeleteProgramPipelines
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),1,&local_298);
  do {
    local_29c = glu::CallLogWrapper::glGetError
                          ((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
    if (local_29c != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_320,"Got Error ",&local_321);
      EVar6 = glu::getErrorStr(local_29c);
      local_358 = EVar6.m_getName;
      local_350 = EVar6.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_348,&local_358);
      std::operator+(&local_300,&local_320,&local_348);
      std::operator+(&local_2e0,&local_300,": ");
      std::operator+(&local_2c0,&local_2e0,"setup");
      tcu::ResultCollector::fail((ResultCollector *)local_78,&local_2c0);
      std::__cxx11::string::~string((string *)&local_2c0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  deqp::gls::StateQueryUtil::verifyStateInteger
            ((ResultCollector *)local_78,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             0x825a,0,this->m_verifierType);
  tcu::ScopedLogSection::~ScopedLogSection(&local_248);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_78,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_78);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  return STOP;
}

Assistant:

ProgramPipelineBindingCase::IterateResult ProgramPipelineBindingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section(m_testCtx.getLog(), "Initial", "Initial value");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterBinding", "After binding");
		glu::ProgramPipeline		pipeline	(m_context.getRenderContext());

		gl.glBindProgramPipeline(pipeline.getPipeline());
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, pipeline.getPipeline(), m_verifierType);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "AfterDelete", "After deleting");
		glw::GLuint					pipeline	= 0;

		gl.glGenProgramPipelines(1, &pipeline);
		gl.glBindProgramPipeline(pipeline);
		gl.glDeleteProgramPipelines(1, &pipeline);
		GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "setup");

		verifyStateInteger(result, gl, GL_PROGRAM_PIPELINE_BINDING, 0, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}